

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

LY_ERR moveto_scnode(lyxp_set *set,lys_module *moveto_mod,char *ncname,lyxp_axis axis,
                    uint32_t options)

{
  lysc_node *sparent;
  ly_ctx *ctx;
  char *name;
  LY_ERR LVar1;
  int *piVar2;
  long lVar3;
  size_t prefix_len;
  size_t name_len;
  char *pcVar4;
  int iVar5;
  ulong uVar6;
  lyxp_axis axis_00;
  ulong uVar7;
  long lVar8;
  lyxp_node_type node_type;
  lysc_node *iter;
  lyxp_node_type iter_type;
  char local_89;
  ulong local_88;
  ulong local_80;
  uint32_t idx;
  lys_module *local_70;
  ulong local_68;
  long local_60;
  ulong local_58;
  undefined8 local_50;
  lys_module *local_48;
  char *local_40;
  uint32_t mod_idx;
  
  local_70 = (lys_module *)0x0;
  if ((options & 0x20) == 0) {
    local_48 = moveto_mod;
    local_40 = ncname;
    if (set->type != LYXP_SET_SCNODE_SET) {
      ctx = set->ctx;
      pcVar4 = print_set_type(set);
      ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"Cannot apply XPath operation %s on %s.","path operator",
              pcVar4);
      return LY_EVALID;
    }
    uVar7 = (ulong)axis;
    local_88 = (ulong)(options >> 4 & 0x20 | options & 0x10);
    local_58 = (ulong)set->used;
    local_89 = axis - LYXP_AXIS_CHILD < 2 &&
               (ncname != (char *)0x0 && moveto_mod != (lys_module *)0x0);
    local_50 = 0;
    local_80 = uVar7;
    for (uVar6 = 0; uVar6 != local_58; uVar6 = uVar6 + 1) {
      axis_00 = (lyxp_axis)uVar7;
      if (axis_00 < (LYXP_AXIS_PARENT|LYXP_AXIS_DESCENDANT)) {
        lVar8 = uVar6 * 0x18;
        piVar2 = (int *)((long)(set->val).nodes + lVar8 + 0xc);
        if ((0x7fbU >> (axis_00 & 0x1f) & 1) == 0) {
          if (axis_00 != LYXP_AXIS_SELF) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                          ,0x1926,"LY_ERR moveto_axis_scnode_next_in_ctx(int32_t *, enum lyxp_axis)"
                         );
          }
          iVar5 = 2;
          if ((*piVar2 != -2) && (iVar5 = 2, *piVar2 != 2)) goto LAB_001a3987;
        }
        else {
          iVar5 = -1;
          if (*piVar2 != -2) {
            if (*piVar2 != 2) goto LAB_001a3987;
            iVar5 = 0;
          }
        }
        *piVar2 = iVar5;
        iter = (lysc_node *)0x0;
        iter_type = LYXP_NODE_NONE;
        node_type = LYXP_NODE_NONE;
        local_68 = uVar6;
        local_60 = lVar8;
        while( true ) {
          if (node_type != LYXP_NODE_NONE) break;
          LVar1 = moveto_axis_scnode_next_first
                            (&iter,&iter_type,&local_70,&mod_idx,
                             *(lysc_node **)((long)(set->val).nodes + lVar8),
                             *(lyxp_node_type *)((long)(set->val).nodes + lVar8 + 8),axis_00,set,
                             (uint32_t)local_88);
          node_type = iter_type;
          if (LVar1 != LY_SUCCESS) goto LAB_001a3918;
          LVar1 = moveto_scnode_check(iter,(lysc_node *)0x0,set,local_40,local_48);
          if (LVar1 == LY_SUCCESS) {
            LVar1 = lyxp_set_scnode_insert_node(set,iter,node_type,axis_00,&idx);
            if (LVar1 != LY_SUCCESS) {
              return LY_EMEM;
            }
            if (local_68 < idx && idx < (uint)local_58) {
              lVar3 = (ulong)idx * 0x18;
              *(undefined4 *)((long)(set->val).nodes + lVar3 + 0xc) = 3;
              local_50 = CONCAT71((int7)((ulong)lVar3 >> 8),1);
            }
          }
        }
        if (axis_00 < LYXP_AXIS_SELF) {
          LVar1 = (*(code *)(&DAT_001ce89c + *(int *)(&DAT_001ce89c + (local_80 & 0xffffffff) * 4)))
                            ();
          return LVar1;
        }
        iter = (lysc_node *)0x0;
        iter_type = LYXP_NODE_NONE;
        uVar7 = local_80;
        lVar8 = local_60;
LAB_001a3918:
        uVar6 = local_68;
        if ((local_89 != '\0') && (*(int *)((long)&((set->val).nodes)->type + lVar8) == 3)) {
          sparent = *(lysc_node **)((long)&((set->val).nodes)->node + lVar8);
          pcVar4 = local_48->name;
          prefix_len = strlen(pcVar4);
          name = local_40;
          name_len = strlen(local_40);
          LVar1 = ly_nested_ext_schema
                            ((lyd_node *)0x0,sparent,pcVar4,prefix_len,LY_VALUE_JSON,(void *)0x0,
                             name,name_len,&iter,(lysc_ext_instance **)0x0);
          uVar7 = local_80;
          uVar6 = local_68;
          if (LVar1 == LY_SUCCESS) {
            LVar1 = lyxp_set_scnode_insert_node(set,iter,LYXP_NODE_ELEM,(lyxp_axis)local_80,&idx);
            if (LVar1 != LY_SUCCESS) {
              return LY_EMEM;
            }
            uVar6 = local_68;
            if (local_68 < idx && idx < (uint)local_58) {
              lVar8 = (ulong)idx * 0x18;
              *(undefined4 *)((long)(set->val).nodes + lVar8 + 0xc) = 3;
              local_50 = CONCAT71((int7)((ulong)lVar8 >> 8),1);
            }
          }
        }
      }
LAB_001a3987:
    }
    if ((char)local_50 != '\0') {
      for (lVar8 = 0; local_58 * 0x18 - lVar8 != 0; lVar8 = lVar8 + 0x18) {
        if (*(int *)((long)&((set->val).nodes)->pos + lVar8) == 3) {
          *(undefined4 *)((long)&((set->val).nodes)->pos + lVar8) = 2;
        }
      }
      return LY_SUCCESS;
    }
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
moveto_scnode(struct lyxp_set *set, const struct lys_module *moveto_mod, const char *ncname, enum lyxp_axis axis,
        uint32_t options)
{
    ly_bool temp_ctx = 0;
    uint32_t getnext_opts, orig_used, i, mod_idx, idx;
    const struct lys_module *mod = NULL;
    const struct lysc_node *iter;
    enum lyxp_node_type iter_type;

    if (options & LYXP_SKIP_EXPR) {
        return LY_SUCCESS;
    }

    if (set->type != LYXP_SET_SCNODE_SET) {
        LOGVAL(set->ctx, LY_VCODE_XP_INOP_1, "path operator", print_set_type(set));
        return LY_EVALID;
    }

    /* getnext opts */
    getnext_opts = 0;
    if (options & LYXP_SCNODE_OUTPUT) {
        getnext_opts |= LYS_GETNEXT_OUTPUT;
    }
    if (options & LYXP_SCNODE_SCHEMAMOUNT) {
        getnext_opts |= LYS_GETNEXT_WITHSCHEMAMOUNT;
    }

    orig_used = set->used;
    for (i = 0; i < orig_used; ++i) {
        /* update in_ctx first */
        if (moveto_axis_scnode_next_in_ctx(&set->val.scnodes[i].in_ctx, axis)) {
            /* not usable, skip */
            continue;
        }

        iter = NULL;
        iter_type = 0;
        while (!moveto_axis_scnode_next(&iter, &iter_type, &mod, &mod_idx, set->val.scnodes[i].scnode,
                set->val.scnodes[i].type, axis, set, getnext_opts)) {
            if (moveto_scnode_check(iter, NULL, set, ncname, moveto_mod)) {
                continue;
            }

            /* insert */
            LY_CHECK_RET(lyxp_set_scnode_insert_node(set, iter, iter_type, axis, &idx));

            /* we need to prevent these nodes from being considered in this moveto */
            if ((idx < orig_used) && (idx > i)) {
                set->val.scnodes[idx].in_ctx = LYXP_SET_SCNODE_ATOM_NEW_CTX;
                temp_ctx = 1;
            }
        }

        if (moveto_mod && ncname && ((axis == LYXP_AXIS_DESCENDANT) || (axis == LYXP_AXIS_CHILD)) &&
                (set->val.scnodes[i].type == LYXP_NODE_ELEM) && !ly_nested_ext_schema(NULL, set->val.scnodes[i].scnode,
                moveto_mod->name, strlen(moveto_mod->name), LY_VALUE_JSON, NULL, ncname, strlen(ncname), &iter, NULL)) {
            /* there is a matching node from an extension, use it */
            LY_CHECK_RET(lyxp_set_scnode_insert_node(set, iter, LYXP_NODE_ELEM, axis, &idx));
            if ((idx < orig_used) && (idx > i)) {
                set->val.scnodes[idx].in_ctx = LYXP_SET_SCNODE_ATOM_NEW_CTX;
                temp_ctx = 1;
            }
        }
    }

    /* correct temporary in_ctx values */
    if (temp_ctx) {
        for (i = 0; i < orig_used; ++i) {
            if (set->val.scnodes[i].in_ctx == LYXP_SET_SCNODE_ATOM_NEW_CTX) {
                set->val.scnodes[i].in_ctx = LYXP_SET_SCNODE_ATOM_CTX;
            }
        }
    }

    return LY_SUCCESS;
}